

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::internal::MemoryBuffer<char,_50UL,_std::allocator<char>_>::grow
          (MemoryBuffer<char,_50UL,_std::allocator<char>_> *this,size_t size)

{
  char *pcVar1;
  char *ptr;
  new_allocator<char> *this_00;
  ulong in_RSI;
  char *in_RDI;
  char *old_ptr;
  size_t old_capacity;
  char *new_ptr;
  size_t new_capacity;
  char *__p;
  void *in_stack_ffffffffffffffc0;
  new_allocator<char> *in_stack_ffffffffffffffd0;
  size_t local_18;
  
  local_18 = *(long *)(in_RDI + 0x18) + (*(ulong *)(in_RDI + 0x18) >> 1);
  if (local_18 < in_RSI) {
    local_18 = in_RSI;
  }
  ptr = __gnu_cxx::new_allocator<char>::allocate
                  (in_stack_ffffffffffffffd0,(size_type)in_RDI,in_stack_ffffffffffffffc0);
  __p = *(char **)(in_RDI + 8);
  this_00 = (new_allocator<char> *)(*(long *)(in_RDI + 8) + *(long *)(in_RDI + 0x10));
  make_ptr<char>(ptr,local_18);
  std::uninitialized_copy<char*,char*>((char *)in_stack_ffffffffffffffd0,in_RDI,(char *)this_00);
  pcVar1 = *(char **)(in_RDI + 8);
  *(size_t *)(in_RDI + 0x18) = local_18;
  *(char **)(in_RDI + 8) = ptr;
  if (pcVar1 != in_RDI + 0x20) {
    __gnu_cxx::new_allocator<char>::deallocate(this_00,__p,0x6fc50e);
  }
  return;
}

Assistant:

void MemoryBuffer<T, SIZE, Allocator>::grow(std::size_t size) {
  std::size_t new_capacity = this->capacity_ + this->capacity_ / 2;
  if (size > new_capacity)
      new_capacity = size;
  T *new_ptr = this->allocate(new_capacity);
  // The following code doesn't throw, so the raw pointer above doesn't leak.
  std::uninitialized_copy(this->ptr_, this->ptr_ + this->size_,
                          make_ptr(new_ptr, new_capacity));
  std::size_t old_capacity = this->capacity_;
  T *old_ptr = this->ptr_;
  this->capacity_ = new_capacity;
  this->ptr_ = new_ptr;
  // deallocate may throw (at least in principle), but it doesn't matter since
  // the buffer already uses the new storage and will deallocate it in case
  // of exception.
  if (old_ptr != data_)
    Allocator::deallocate(old_ptr, old_capacity);
}